

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

Am_Constraint * __thiscall am_CList::Remove_Con(am_CList *this,CItem *item)

{
  CItem *pCVar1;
  Am_Constraint *pAVar2;
  CItem *pCVar3;
  CItem **ppCVar4;
  
  pCVar3 = (CItem *)0x0;
  ppCVar4 = &this->head;
  while (pCVar1 = *ppCVar4, pCVar1 != (CItem *)0x0) {
    if (pCVar1 == item) {
      ppCVar4 = &pCVar3->next;
      if (pCVar3 == (CItem *)0x0) {
        ppCVar4 = &this->head;
      }
      *ppCVar4 = pCVar1->next;
    }
    pCVar3 = pCVar1;
    ppCVar4 = &pCVar1->next;
  }
  pAVar2 = item->value;
  item->value = (Am_Constraint *)0x0;
  (item->field_1).prev = (CItem *)0x0;
  item->next = (CItem *)0x0;
  CItem::operator_delete(item,0x18);
  return pAVar2;
}

Assistant:

Am_Constraint *
am_CList::Remove_Con(CItem *item)
{
  CItem *prev = nullptr;
  CItem *curr = head;
  while (curr) {
    if (item == curr) {
      if (prev)
        prev->next = curr->next;
      else
        head = curr->next;
    }
    prev = curr;
    curr = curr->next;
  }
  Am_Constraint *value = item->value;
  item->prev = nullptr;
  item->next = nullptr;
  item->value = nullptr;
  delete item;
  return value;
}